

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O1

DecoderBuffer *
draco::parser::ParseLineIntoDecoderBuffer
          (DecoderBuffer *__return_storage_ptr__,DecoderBuffer *buffer)

{
  char *data;
  char cVar1;
  long lVar2;
  long lVar3;
  
  data = buffer->data_ + buffer->pos_;
  lVar2 = buffer->pos_;
  do {
    lVar3 = lVar2 + 1;
    if (buffer->data_size_ < lVar3) break;
    cVar1 = buffer->data_[lVar2];
    buffer->pos_ = lVar3;
    lVar2 = lVar3;
  } while (cVar1 != '\n');
  DecoderBuffer::DecoderBuffer(__return_storage_ptr__);
  DecoderBuffer::Init(__return_storage_ptr__,data,
                      (size_t)(buffer->data_ + (buffer->pos_ - (long)data)));
  return __return_storage_ptr__;
}

Assistant:

DecoderBuffer ParseLineIntoDecoderBuffer(DecoderBuffer *buffer) {
  const char *const head = buffer->data_head();
  char c;
  while (buffer->Peek(&c)) {
    // Skip the character.
    buffer->Advance(1);
    if (c == '\n') {
      break;  // End of the line reached.
    }
    if (c == '\r') {
      continue;  // Ignore extra line ending characters.
    }
  }
  DecoderBuffer out_buffer;
  out_buffer.Init(head, buffer->data_head() - head);
  return out_buffer;
}